

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

void Abc_ShaManStop(Abc_ShaMan_t *p)

{
  int iVar1;
  Vec_Vec_t *p_00;
  int local_1c;
  int i;
  Vec_Ptr_t *vBucket;
  Abc_ShaMan_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vBuckets), local_1c < iVar1; local_1c = local_1c + 1) {
    p_00 = (Vec_Vec_t *)Vec_PtrEntry(p->vBuckets,local_1c);
    Vec_VecFree(p_00);
  }
  Vec_PtrFreeP(&p->vBuckets);
  Vec_IntFreeP(&p->vObj2Lit);
  if (p != (Abc_ShaMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Abc_ShaManStop( Abc_ShaMan_t * p )
{
    Vec_Ptr_t * vBucket;
    int i;
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
        Vec_VecFree( (Vec_Vec_t *)vBucket );
    Vec_PtrFreeP( &p->vBuckets );
    Vec_IntFreeP( &p->vObj2Lit );
    ABC_FREE( p );
}